

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall absl::lts_20250127::log_internal::LogMessage::SendToLog(LogMessage *this)

{
  bool bVar1;
  pointer this_00;
  pointer pLVar2;
  undefined1 in_R8B;
  Span<absl::lts_20250127::LogSink_*> SVar3;
  LogEntry *local_20;
  size_type local_18;
  LogMessage *this_local;
  
  bVar1 = IsFatal(this);
  if (bVar1) {
    PrepareToDie(this);
  }
  this_00 = std::
            unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            ::operator->(&this->data_);
  pLVar2 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  SVar3 = MakeSpan<absl::lts_20250127::InlinedVector<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>_>
                    (&pLVar2->extra_sinks);
  pLVar2 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  local_20 = (LogEntry *)SVar3.ptr_;
  local_18 = SVar3.len_;
  SVar3.len_._0_1_ = pLVar2->extra_sinks_only & 1;
  SVar3.ptr_ = (pointer)local_18;
  SVar3.len_._1_7_ = 0;
  LogToSinks((log_internal *)this_00,local_20,SVar3,(bool)in_R8B);
  bVar1 = IsFatal(this);
  if (bVar1) {
    Die(this);
  }
  return;
}

Assistant:

void LogMessage::SendToLog() {
  if (IsFatal()) PrepareToDie();
  // Also log to all registered sinks, even if OnlyLogToStderr() is set.
  log_internal::LogToSinks(data_->entry, absl::MakeSpan(data_->extra_sinks),
                           data_->extra_sinks_only);
  if (IsFatal()) Die();
}